

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

vm_httpreq_ext * vm_httpreq_ext::alloc_ext(CVmObjHTTPRequest *self)

{
  int iVar1;
  undefined4 extraout_var;
  vm_httpreq_ext *pvVar2;
  
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x18,self);
  pvVar2 = (vm_httpreq_ext *)CONCAT44(extraout_var,iVar1);
  pvVar2->req = (TadsHttpRequest *)0x0;
  pvVar2->cookies = (vm_httpreq_cookie *)0x0;
  return pvVar2;
}

Assistant:

vm_httpreq_ext *vm_httpreq_ext::alloc_ext(VMG_ CVmObjHTTPRequest *self)
{
    /* calculate how much space we need */
    size_t siz = sizeof(vm_httpreq_ext);

    /* allocate the memory */
    vm_httpreq_ext *ext = (vm_httpreq_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* we don't have a system message object yet */
    ext->req = 0;

    /* we have no reply cookies yet */
    ext->cookies = 0;

    /* return the new extension */
    return ext;
}